

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall
QTextDocumentPrivate::setCharFormat
          (QTextDocumentPrivate *this,int pos,int length,QTextCharFormat *newFormat,
          FormatChangeMode mode)

{
  FragmentMap *this_00;
  QTextFormatCollection *this_01;
  int iVar1;
  QTextFragmentData *pQVar2;
  QTextLayout *pQVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint k;
  long in_FS_OFFSET;
  bool bVar9;
  int local_d4;
  undefined1 local_98 [40];
  uint local_70;
  QTextFormat local_68;
  undefined1 local_58 [16];
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  iVar4 = this->editBlock;
  this->editBlock = iVar4 + 1;
  if (iVar4 == 0) {
    this->revision = this->revision + 1;
  }
  if (mode == SetFormatAndPreserveObjectIndices) {
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::QTextFormat((QTextFormat *)local_98,&newFormat->super_QTextFormat);
    QTextFormat::clearProperty((QTextFormat *)local_98,0);
    local_d4 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_98);
    QTextFormat::~QTextFormat((QTextFormat *)local_98);
  }
  else {
    local_d4 = -1;
    if (mode == SetFormat) {
      local_d4 = QTextFormatCollection::indexForFormat(&this->formats,&newFormat->super_QTextFormat)
      ;
    }
  }
  if (pos == -1) {
    if (mode == MergeFormat) {
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format((QTextFormatCollection *)local_98,(int)&this->formats);
      QTextFormat::merge((QTextFormat *)local_98,&newFormat->super_QTextFormat);
      iVar4 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_98);
      this->initialBlockCharFormatIndex = iVar4;
      QTextFormat::~QTextFormat((QTextFormat *)local_98);
    }
    else {
      if (mode == SetFormatAndPreserveObjectIndices) {
        QTextFormatCollection::format
                  ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)this + 0xe8);
        iVar4 = QTextFormat::objectIndex((QTextFormat *)&stack0xffffffffffffffb8);
        bVar9 = iVar4 != -1;
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::QTextFormat((QTextFormat *)local_98,&newFormat->super_QTextFormat);
        QTextFormatCollection::format((QTextFormatCollection *)local_58,(int)&this->formats);
        iVar4 = QTextFormat::objectIndex((QTextFormat *)local_58);
        QTextFormat::setObjectIndex((QTextFormat *)local_98,iVar4);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        iVar4 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_98);
        this->initialBlockCharFormatIndex = iVar4;
        QTextFormat::~QTextFormat((QTextFormat *)local_98);
      }
      else {
        this->initialBlockCharFormatIndex = local_d4;
      }
    }
    length = length + -1;
    pos = 0;
  }
  iVar4 = pos + length;
  split(this,pos);
  split(this,iVar4);
  if (0 < length) {
    this_00 = &this->fragments;
    this_01 = &this->formats;
    k = pos;
    do {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      uVar5 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,k,0);
      local_58._8_4_ = uVar5;
      pQVar2 = (this_00->data).field_0.fragments;
      local_58._0_8_ = this_00;
      iVar6 = QFragmentMap<QTextFragmentData>::Iterator::position((Iterator *)local_58);
      iVar6 = (iVar6 - k) + pQVar2[uVar5].super_QFragment<1>.size_array[0];
      if ((int)(iVar4 - k) < iVar6) {
        iVar6 = iVar4 - k;
      }
      iVar1 = pQVar2[uVar5].format;
      iVar8 = (int)this_01;
      if (mode == MergeFormat) {
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormatCollection::format((QTextFormatCollection *)local_98,iVar8);
        QTextFormat::merge((QTextFormat *)local_98,&newFormat->super_QTextFormat);
        iVar8 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_98);
        pQVar2[uVar5].format = iVar8;
        QTextFormat::~QTextFormat((QTextFormat *)local_98);
      }
      else {
        if (mode == SetFormatAndPreserveObjectIndices) {
          QTextFormatCollection::format((QTextFormatCollection *)&local_68,iVar8);
          iVar7 = QTextFormat::objectIndex(&local_68);
          bVar9 = iVar7 != -1;
          QTextFormat::~QTextFormat(&local_68);
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::QTextFormat((QTextFormat *)local_98,&newFormat->super_QTextFormat);
          QTextFormatCollection::format((QTextFormatCollection *)(local_98 + 0x20),iVar8);
          iVar8 = QTextFormat::objectIndex((QTextFormat *)(local_98 + 0x20));
          QTextFormat::setObjectIndex((QTextFormat *)local_98,iVar8);
          QTextFormat::~QTextFormat((QTextFormat *)(local_98 + 0x20));
          iVar8 = QTextFormatCollection::indexForFormat(this_01,(QTextFormat *)local_98);
          pQVar2[uVar5].format = iVar8;
          QTextFormat::~QTextFormat((QTextFormat *)local_98);
        }
        else {
          pQVar2[uVar5].format = local_d4;
        }
      }
      local_98._20_4_ = 0xaaaaaaaa;
      local_98._28_4_ = 0xaaaaaaaa;
      local_98._4_4_ = iVar1;
      local_98._0_4_ = 0x1010002;
      local_98._8_8_ = (ulong)k << 0x20;
      local_98._24_4_ = 0;
      local_98._16_4_ = iVar6;
      appendUndoItem(this,(QTextUndoCommand *)local_98);
      k = k + iVar6;
    } while ((int)k < iVar4);
  }
  uVar5 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos - 1,0);
  if (uVar5 != 0) {
    unite(this,uVar5);
  }
  uVar5 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,iVar4,0);
  if (uVar5 != 0) {
    unite(this,uVar5);
  }
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  uVar5 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
  local_98._8_4_ = uVar5;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = this;
  uVar5 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,iVar4,0);
  local_58._0_8_ = this;
  local_58._8_4_ = uVar5;
  bVar9 = QTextBlock::isValid((QTextBlock *)local_58);
  if (bVar9) {
    QTextBlock::next((QTextBlock *)(local_98 + 0x20));
    local_58._0_8_ = local_98._32_8_;
    local_58._8_4_ = local_70;
  }
  bVar9 = QTextBlock::isValid((QTextBlock *)local_98);
  if (bVar9) {
    do {
      if ((local_98._0_8_ == local_58._0_8_) && (local_98._8_4_ == local_58._8_4_)) break;
      pQVar3 = (((BlockMap *)(local_98._0_8_ + 0x160))->data).field_0.fragments
               [local_98._8_8_ & 0xffffffff].layout;
      if (pQVar3 != (QTextLayout *)0x0) {
        QTextEngine::invalidate(pQVar3->d);
      }
      QTextBlock::next((QTextBlock *)(local_98 + 0x20));
      local_98._0_8_ = local_98._32_8_;
      local_98._8_4_ = local_70;
      bVar9 = QTextBlock::isValid((QTextBlock *)local_98);
    } while (bVar9);
  }
  documentChange(this,pos,length);
  endEditBlock(this);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::setCharFormat(int pos, int length, const QTextCharFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormatAndPreserveObjectIndices) {
        QTextCharFormat cleanFormat = newFormat;
        cleanFormat.clearProperty(QTextFormat::ObjectIndex);
        newFormatIdx = formats.indexForFormat(cleanFormat);
    } else if (mode == SetFormat) {
        newFormatIdx = formats.indexForFormat(newFormat);
    }

    if (pos == -1) {
        if (mode == MergeFormat) {
            QTextFormat format = formats.format(initialBlockCharFormatIndex);
            format.merge(newFormat);
            initialBlockCharFormatIndex = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(initialBlockCharFormatIndex).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(initialBlockCharFormatIndex).objectIndex());
            initialBlockCharFormatIndex = formats.indexForFormat(f);
        } else {
            initialBlockCharFormatIndex = newFormatIdx;
        }

        ++pos;
        --length;
    }

    const int startPos = pos;
    const int endPos = pos + length;

    split(startPos);
    split(endPos);

    while (pos < endPos) {
        FragmentMap::Iterator it = fragments.find(pos);
        Q_ASSERT(!it.atEnd());

        QTextFragmentData *fragment = it.value();

        Q_ASSERT(formats.format(fragment->format).type() == QTextFormat::CharFormat);

        int offset = pos - it.position();
        int length = qMin(endPos - pos, int(fragment->size_array[0] - offset));
        int oldFormat = fragment->format;

        if (mode == MergeFormat) {
            QTextFormat format = formats.format(fragment->format);
            format.merge(newFormat);
            fragment->format = formats.indexForFormat(format);
        } else if (mode == SetFormatAndPreserveObjectIndices
                   && formats.format(oldFormat).objectIndex() != -1) {
            QTextCharFormat f = newFormat;
            f.setObjectIndex(formats.format(oldFormat).objectIndex());
            fragment->format = formats.indexForFormat(f);
        } else {
            fragment->format = newFormatIdx;
        }

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::CharFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, pos, length, 0);
        appendUndoItem(c);

        pos += length;
        Q_ASSERT(q20::cmp_equal(pos, (it.position() + fragment->size_array[0])) || pos >= endPos);
    }

    int n = fragments.findNode(startPos - 1);
    if (n)
        unite(n);

    n = fragments.findNode(endPos);
    if (n)
        unite(n);

    QTextBlock blockIt = blocksFind(startPos);
    QTextBlock endIt = blocksFind(endPos);
    if (endIt.isValid())
        endIt = endIt.next();
    for (; blockIt.isValid() && blockIt != endIt; blockIt = blockIt.next())
        QTextDocumentPrivate::block(blockIt)->invalidate();

    documentChange(startPos, length);

    endEditBlock();
}